

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * slang::ast::Type::fromSyntax
                 (Compilation *compilation,DataTypeSyntax *node,ASTContext *context,
                 Type *typedefTarget)

{
  SyntaxKind SVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  bool bVar2;
  int iVar3;
  IntegerTypeSyntax *pIVar4;
  reference ppVVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  SourceLocation in_RDX;
  SyntaxNode *in_RSI;
  SourceLocation in_RDI;
  VirtualInterfaceTypeSyntax *unaff_retaddr;
  ASTContext *in_stack_00000008;
  ASTContext *in_stack_00000048;
  bool in_stack_00000053;
  SyntaxKind in_stack_00000054;
  Compilation *in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  Expression *expr;
  ExpressionSyntax *exprSyntax;
  ImplicitTypeSyntax *implicit;
  StructUnionTypeSyntax *structUnion_1;
  StructUnionTypeSyntax *structUnion;
  ASTContext *in_stack_00000108;
  Diagnostic *diag;
  IntegerTypeSyntax *its;
  bool in_stack_0000014f;
  ASTContext *in_stack_00000150;
  NameSyntax *in_stack_00000158;
  Compilation *in_stack_00000160;
  ASTContext *in_stack_000002a8;
  StructUnionTypeSyntax *in_stack_000002b0;
  Compilation *in_stack_000002b8;
  Compilation *in_stack_fffffffffffffeb8;
  Expression *in_stack_fffffffffffffec0;
  TokenKind kind;
  bitmask<slang::ast::CompilationFlags> flags;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_fffffffffffffec8;
  ASTContext *in_stack_fffffffffffffed0;
  SourceLocation in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int __fd;
  DiagCode in_stack_fffffffffffffee4;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffef0;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  SyntaxKind in_stack_ffffffffffffff0c;
  undefined4 uVar8;
  Compilation *in_stack_ffffffffffffff10;
  bitmask<slang::ast::CompilationFlags> local_9c;
  underlying_type local_98;
  undefined8 local_90;
  ExpressionSyntax *local_88;
  ImplicitTypeSyntax *local_70;
  StructUnionTypeSyntax *local_68;
  StructUnionTypeSyntax *local_60;
  undefined1 in_stack_ffffffffffffffa8 [16];
  Compilation *in_stack_ffffffffffffffb8;
  
  code = SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0);
  SVar1 = in_RSI->kind;
  if (SVar1 == BitType) goto LAB_005658cb;
  if (SVar1 == ByteType) goto LAB_00565907;
  if (SVar1 != CHandleType) {
    if (SVar1 == EnumType) {
      slang::syntax::SyntaxNode::as<slang::syntax::EnumTypeSyntax>(in_RSI);
      pTVar6 = EnumType::findDefinition
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8._8_8_,
                          in_stack_ffffffffffffffa8._0_8_);
      return pTVar6;
    }
    if (SVar1 != EventType) {
      if (SVar1 == ImplicitType) {
        local_70 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>(in_RSI);
        std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>_&>
                  ((span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                    *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        pTVar6 = IntegralType::fromSyntax
                           (in_stack_00000058,in_stack_00000054,
                            (span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                             )in_stack_00000060,in_stack_00000053,in_stack_00000048);
        return pTVar6;
      }
      if ((SVar1 != IntType) && (SVar1 != IntegerType)) {
        if (SVar1 == LogicType) {
LAB_005658cb:
          slang::syntax::SyntaxNode::as<slang::syntax::IntegerTypeSyntax>(in_RSI);
          pTVar6 = IntegralType::fromSyntax
                             ((Compilation *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (IntegerTypeSyntax *)in_stack_fffffffffffffed8,
                              in_stack_fffffffffffffed0);
          return pTVar6;
        }
        if (SVar1 != LongIntType) {
          if (SVar1 == NamedType) {
            slang::syntax::SyntaxNode::as<slang::syntax::NamedTypeSyntax>(in_RSI);
            not_null<slang::syntax::NameSyntax_*>::operator*
                      ((not_null<slang::syntax::NameSyntax_*> *)0x565be9);
            pTVar6 = lookupNamedType(in_stack_00000160,in_stack_00000158,in_stack_00000150,
                                     in_stack_0000014f);
            return pTVar6;
          }
          if ((SVar1 != PropertyType) && (1 < SVar1 - RealTimeType)) {
            if (SVar1 == RegType) goto LAB_005658cb;
            if (SVar1 != SequenceType) {
              if (SVar1 == ShortIntType) goto LAB_00565907;
              if ((SVar1 != ShortRealType) && (SVar1 != StringType)) {
                if (SVar1 == StructType) {
                  local_60 = slang::syntax::SyntaxNode::as<slang::syntax::StructUnionTypeSyntax>
                                       (in_RSI);
                  bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x565ae3);
                  if (bVar2) {
                    pTVar6 = PackedStructType::fromSyntax
                                       (in_stack_000002b8,in_stack_000002b0,in_stack_000002a8);
                    uVar7 = SUB84(pTVar6,0);
                    uVar8 = (undefined4)((ulong)pTVar6 >> 0x20);
                  }
                  else {
                    pTVar6 = UnpackedStructType::fromSyntax
                                       ((ASTContext *)its,(StructUnionTypeSyntax *)diag);
                    uVar7 = SUB84(pTVar6,0);
                    uVar8 = (undefined4)((ulong)pTVar6 >> 0x20);
                  }
                  return (Type *)CONCAT44(uVar8,uVar7);
                }
                if (SVar1 == TimeType) goto LAB_00565907;
                if (SVar1 == TypeReference) {
                  slang::syntax::SyntaxNode::as<slang::syntax::TypeReferenceSyntax>(in_RSI);
                  local_88 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x565cbe);
                  __fd = (int)local_88;
                  uVar7 = (undefined4)((ulong)local_88 >> 0x20);
                  local_98 = (underlying_type)
                             ast::operator|((ASTFlags)in_stack_fffffffffffffec8,
                                            (ASTFlags)in_stack_fffffffffffffec0);
                  iVar3 = Expression::bind(__fd,(sockaddr *)in_RDX,(socklen_t)local_98);
                  local_90 = CONCAT44(extraout_var,iVar3);
                  bVar2 = Expression::bad(in_stack_fffffffffffffec0);
                  if (!bVar2) {
                    bVar2 = Expression::hasHierarchicalReference(in_stack_fffffffffffffec0);
                    flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffec0 >> 0x20);
                    if (bVar2) {
                      bitmask<slang::ast::CompilationFlags>::bitmask
                                (&local_9c,AllowHierarchicalConst);
                      bVar2 = Compilation::hasFlag(in_stack_fffffffffffffeb8,flags);
                      in_stack_fffffffffffffed8 = in_RDI;
                      if (!bVar2) {
                        slang::syntax::SyntaxNode::sourceRange
                                  ((SyntaxNode *)in_stack_ffffffffffffff10);
                        sourceRange.startLoc._4_4_ = uVar7;
                        sourceRange.startLoc._0_4_ = __fd;
                        sourceRange.endLoc = in_RDX;
                        ASTContext::addDiag((ASTContext *)in_RDI,code,sourceRange);
                        in_stack_fffffffffffffed8 = in_RDI;
                      }
                    }
                    not_null<const_slang::ast::Type_*>::operator->
                              ((not_null<const_slang::ast::Type_*> *)0x565de3);
                    bVar2 = isVoid((Type *)0x565deb);
                    if (bVar2) {
                      slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)in_stack_ffffffffffffff10);
                      sourceRange_00.startLoc._4_4_ = uVar7;
                      sourceRange_00.startLoc._0_4_ = __fd;
                      sourceRange_00.endLoc = in_RDX;
                      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffed8,code,
                                          sourceRange_00);
                    }
                  }
                  pTVar6 = not_null<const_slang::ast::Type_*>::operator*
                                     ((not_null<const_slang::ast::Type_*> *)0x565e5c);
                  return pTVar6;
                }
                if (SVar1 == UnionType) {
                  local_68 = slang::syntax::SyntaxNode::as<slang::syntax::StructUnionTypeSyntax>
                                       (in_RSI);
                  bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x565b5f);
                  if ((!bVar2) && ((local_68->taggedOrSoft).kind != SoftKeyword)) {
                    pTVar6 = UnpackedUnionType::fromSyntax
                                       ((ASTContext *)node,(StructUnionTypeSyntax *)context);
                    return pTVar6;
                  }
                  pTVar6 = PackedUnionType::fromSyntax
                                     ((Compilation *)its,(StructUnionTypeSyntax *)diag,
                                      in_stack_00000108);
                  return pTVar6;
                }
                if ((SVar1 != Untyped) && (SVar1 == VirtualInterfaceType)) {
                  slang::syntax::SyntaxNode::as<slang::syntax::VirtualInterfaceTypeSyntax>(in_RSI);
                  pTVar6 = VirtualInterfaceType::fromSyntax(in_stack_00000008,unaff_retaddr);
                  return pTVar6;
                }
              }
            }
          }
          goto LAB_00565a5d;
        }
      }
LAB_00565907:
      pIVar4 = slang::syntax::SyntaxNode::as<slang::syntax::IntegerTypeSyntax>(in_RSI);
      kind = (TokenKind)((ulong)in_stack_fffffffffffffec0 >> 0x30);
      bVar2 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         0x565931);
      if (!bVar2) {
        ppVVar5 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::
                  operator[](&(pIVar4->dimensions).
                              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                             ,0);
        parsing::Token::location(&(*ppVVar5)->openBracket);
        ASTContext::addDiag(in_stack_fffffffffffffed0,in_stack_fffffffffffffee4,
                            in_stack_fffffffffffffed8);
        parsing::LexerFacts::getTokenKindText(kind);
        arg._M_len._4_4_ = in_stack_ffffffffffffff0c;
        arg._M_len._0_4_ = in_stack_ffffffffffffff08;
        arg._M_str = (char *)in_stack_ffffffffffffff10;
        Diagnostic::operator<<(in_stack_ffffffffffffff00,arg);
      }
      bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x5659fa);
      if (!bVar2) {
        pTVar6 = Compilation::getType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        return pTVar6;
      }
      pTVar6 = getPredefinedType((Compilation *)in_stack_fffffffffffffed8,
                                 (SyntaxKind)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                                 SUB81((ulong)in_stack_fffffffffffffed0 >> 0x18,0));
      return pTVar6;
    }
  }
LAB_00565a5d:
  pTVar6 = Compilation::getType(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  return pTVar6;
}

Assistant:

const Type& Type::fromSyntax(Compilation& compilation, const DataTypeSyntax& node,
                             const ASTContext& context, const Type* typedefTarget) {
    switch (node.kind) {
        case SyntaxKind::BitType:
        case SyntaxKind::LogicType:
        case SyntaxKind::RegType:
            return IntegralType::fromSyntax(compilation, node.as<IntegerTypeSyntax>(), context);
        case SyntaxKind::ByteType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::IntType:
        case SyntaxKind::LongIntType:
        case SyntaxKind::IntegerType:
        case SyntaxKind::TimeType: {
            auto& its = node.as<IntegerTypeSyntax>();
            if (!its.dimensions.empty()) {
                // Error but don't fail out; just remove the dims and keep trucking
                auto& diag = context.addDiag(diag::PackedDimsOnPredefinedType,
                                             its.dimensions[0]->openBracket.location());
                diag << LexerFacts::getTokenKindText(its.keyword.kind);
            }

            if (!its.signing)
                return compilation.getType(node.kind);

            return getPredefinedType(compilation, node.kind,
                                     its.signing.kind == TokenKind::SignedKeyword);
        }
        case SyntaxKind::RealType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::EventType:
        case SyntaxKind::VoidType:
        case SyntaxKind::Untyped:
        case SyntaxKind::PropertyType:
        case SyntaxKind::SequenceType:
            return compilation.getType(node.kind);
        case SyntaxKind::EnumType:
            return EnumType::findDefinition(compilation, node.as<EnumTypeSyntax>(), context);
        case SyntaxKind::StructType: {
            const auto& structUnion = node.as<StructUnionTypeSyntax>();
            return structUnion.packed
                       ? PackedStructType::fromSyntax(compilation, structUnion, context)
                       : UnpackedStructType::fromSyntax(context, structUnion);
        }
        case SyntaxKind::UnionType: {
            const auto& structUnion = node.as<StructUnionTypeSyntax>();
            return (structUnion.packed || structUnion.taggedOrSoft.kind == TokenKind::SoftKeyword)
                       ? PackedUnionType::fromSyntax(compilation, structUnion, context)
                       : UnpackedUnionType::fromSyntax(context, structUnion);
        }
        case SyntaxKind::NamedType:
            return lookupNamedType(compilation, *node.as<NamedTypeSyntax>().name, context,
                                   typedefTarget != nullptr);
        case SyntaxKind::ImplicitType: {
            auto& implicit = node.as<ImplicitTypeSyntax>();
            return IntegralType::fromSyntax(compilation, SyntaxKind::LogicType, implicit.dimensions,
                                            implicit.signing.kind == TokenKind::SignedKeyword,
                                            context);
        }
        case SyntaxKind::TypeReference: {
            auto& exprSyntax = *node.as<TypeReferenceSyntax>().expr;
            auto& expr = Expression::bind(exprSyntax, context,
                                          ASTFlags::AllowDataType | ASTFlags::TypeOperator);

            if (!expr.bad()) {
                if (expr.hasHierarchicalReference() &&
                    !compilation.hasFlag(CompilationFlags::AllowHierarchicalConst)) {
                    context.addDiag(diag::TypeRefHierarchical, exprSyntax.sourceRange());
                }

                if (expr.type->isVoid())
                    context.addDiag(diag::TypeRefVoid, exprSyntax.sourceRange());
            }

            return *expr.type;
        }
        case SyntaxKind::VirtualInterfaceType:
            return VirtualInterfaceType::fromSyntax(context, node.as<VirtualInterfaceTypeSyntax>());
        default:
            SLANG_UNREACHABLE;
    }
}